

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH6
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  uint uVar10;
  long lVar11;
  uint64_t uVar12;
  uint16_t *puVar13;
  long lVar14;
  long lVar15;
  void *pvVar16;
  int iVar17;
  bool bVar18;
  bool bVar19;
  size_t sVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  size_t *psVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  BrotliTransforms *pBVar29;
  byte bVar30;
  int iVar31;
  size_t sVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  char *pcVar37;
  ulong uVar38;
  ushort uVar39;
  uint uVar40;
  ulong uVar41;
  uint uVar42;
  int iVar43;
  ulong uVar44;
  ulong uVar45;
  uint8_t *puVar46;
  ulong uVar47;
  long lVar48;
  size_t *psVar49;
  long lVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  uint32_t *buckets;
  ulong uVar54;
  uint8_t *puVar55;
  ulong uVar56;
  int *piVar57;
  bool bVar58;
  ulong local_168;
  ulong local_160;
  ulong local_150;
  ulong local_120;
  ulong local_118;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d0;
  size_t *local_c8;
  ulong local_a8;
  
  bVar30 = literal_context_lut[8];
  lVar11 = *(long *)(literal_context_lut + 0x10);
  uVar4 = (position - 7) + num_bytes;
  sVar32 = position;
  if (7 < num_bytes) {
    sVar32 = uVar4;
  }
  lVar33 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar33 = 0x40;
  }
  local_f8 = *(ulong *)dist_cache;
  uVar1 = position + num_bytes;
  uVar21 = *(uint *)&(params->dictionary).words;
  if (4 < (int)uVar21) {
    iVar22 = *(int *)&(hasher->common).extra;
    *(int *)&(hasher->common).dict_num_matches = iVar22 + -1;
    *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar22 + 1;
    (hasher->common).params.type = iVar22 + -2;
    (hasher->common).params.bucket_bits = iVar22 + 2;
    (hasher->common).params.block_bits = iVar22 + -3;
    (hasher->common).params.hash_len = iVar22 + 3;
    if (10 < uVar21) {
      iVar22 = *(int *)((long)&(hasher->common).extra + 4);
      (hasher->common).params.num_last_distances_to_check = iVar22 + -1;
      (hasher->common).is_prepared_ = iVar22 + 1;
      *(int *)&hasher->privat = iVar22 + -2;
      *(int *)((long)&hasher->privat + 4) = iVar22 + 2;
      (hasher->privat)._H5.block_size_ = CONCAT44(iVar22 + 3,iVar22 + -3);
    }
  }
  if (uVar1 <= position + 8) {
    local_c8 = last_insert_len;
LAB_0011646c:
    *(ulong *)dist_cache = (local_f8 + uVar1) - position;
    *(long *)commands = *(long *)commands + ((long)local_c8 - (long)last_insert_len >> 4);
    return;
  }
  uVar5 = (1L << (bVar30 & 0x3f)) - 0x10;
  local_a8 = lVar33 + position;
  lVar3 = position - 1;
  local_c8 = last_insert_len;
  uVar38 = position;
LAB_00114824:
  uVar23 = uVar1 - uVar38;
  uVar34 = uVar5;
  if (uVar38 < uVar5) {
    uVar34 = uVar38;
  }
  local_d0 = lVar11 + uVar38;
  if (uVar5 <= lVar11 + uVar38) {
    local_d0 = uVar5;
  }
  uVar25 = *(ulong *)(literal_context_lut + 0x50);
  uVar12 = (params->dictionary).cutoffTransforms;
  puVar13 = (params->dictionary).hash_table_words;
  uVar45 = uVar38 & ringbuffer_mask;
  psVar49 = *(size_t **)backward_references;
  if (back_refs_position <= psVar49) {
    bVar58 = false;
    bVar18 = back_refs_position == (size_t *)0x0;
LAB_001149b1:
    uVar41 = (ulong)*(int *)&(params->dictionary).words;
    if (uVar41 == 0) {
      local_150 = 0x7e4;
      local_f0 = 0;
      local_e8 = 0;
      uVar52 = 0;
    }
    else {
      puVar46 = ringbuffer + uVar45;
      uVar51 = (ulong)((uint)uVar23 & 7);
      local_150 = 0x7e4;
      uVar52 = 0;
      uVar54 = 0;
      local_e8 = 0;
      local_f0 = 0;
      do {
        uVar47 = (ulong)*(int *)((long)&(hasher->common).extra + uVar54 * 4);
        if (((uVar47 <= uVar34) && (uVar38 - uVar47 < uVar38)) &&
           (uVar52 + uVar45 <= ringbuffer_mask)) {
          uVar26 = uVar38 - uVar47 & ringbuffer_mask;
          if ((uVar26 + uVar52 <= ringbuffer_mask) &&
             (ringbuffer[uVar52 + uVar45] == ringbuffer[uVar26 + uVar52])) {
            if (7 < uVar23) {
              lVar48 = 0;
              uVar36 = 0;
LAB_00114a8e:
              if (*(ulong *)(puVar46 + uVar36 * 8) == *(ulong *)(ringbuffer + uVar36 * 8 + uVar26))
              goto code_r0x00114aa0;
              uVar36 = *(ulong *)(ringbuffer + uVar36 * 8 + uVar26) ^
                       *(ulong *)(puVar46 + uVar36 * 8);
              uVar26 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar36 = (uVar26 >> 3 & 0x1fffffff) - lVar48;
              goto LAB_00114af3;
            }
            uVar53 = 0;
            puVar55 = puVar46;
LAB_00114b93:
            uVar36 = uVar53;
            if (uVar51 != 0) {
              uVar35 = uVar51 | uVar53;
              uVar56 = uVar51;
              do {
                uVar36 = uVar53;
                if (ringbuffer[uVar53 + uVar26] != *puVar55) break;
                puVar55 = puVar55 + 1;
                uVar53 = uVar53 + 1;
                uVar56 = uVar56 - 1;
                uVar36 = uVar35;
              } while (uVar56 != 0);
            }
LAB_00114af3:
            if ((bVar58) && ((ulong)(long)(int)num_literals[(long)psVar49 * 2] < uVar36 + uVar38)) {
              uVar36 = (long)(int)num_literals[(long)psVar49 * 2] - uVar38;
            }
            if (((2 < uVar36) || ((uVar54 < 2 && (uVar36 == 2)))) &&
               (uVar26 = uVar36 * 0x87 + 0x78f, local_150 < uVar26)) {
              if (uVar54 != 0) {
                uVar26 = uVar26 - ((0x1ca10U >> ((byte)uVar54 & 0xe) & 0xe) + 0x27);
              }
              if (local_150 < uVar26) {
                uVar52 = uVar36;
                local_150 = uVar26;
                local_f0 = uVar47;
                local_e8 = uVar36;
              }
            }
          }
        }
        uVar54 = uVar54 + 1;
      } while (uVar54 != uVar41);
    }
    uVar41._0_4_ = (params->dist).alphabet_size_max;
    uVar41._4_4_ = (params->dist).alphabet_size_limit;
    uVar41 = (*(ulong *)(ringbuffer + uVar45) & uVar41) * 0x1fe35a7bd3579bd3 >>
             ((byte)(params->dist).distance_postfix_bits & 0x3f);
    uVar54 = uVar41 & 0xffffffff;
    uVar21 = (int)uVar41 << (*(byte *)((long)&(params->dist).max_distance + 4) & 0x1f);
    piVar2 = (int *)(ringbuffer + uVar45);
    uVar6 = *(ushort *)(uVar12 + uVar54 * 2);
    uVar51 = (ulong)uVar6;
    piVar57 = &(params->hasher).num_last_distances_to_check;
    uVar41 = 0;
    if (*(ulong *)piVar57 <= uVar51) {
      uVar41 = uVar51 - *(long *)piVar57;
    }
    uVar40 = (uint)(params->dist).max_distance;
    if (uVar41 < uVar51) {
      uVar47 = (ulong)((uint)uVar23 & 7);
      do {
        uVar51 = uVar51 - 1;
        uVar42 = *(uint *)(puVar13 + (ulong)uVar21 * 2 + (ulong)((uint)uVar51 & uVar40) * 2);
        uVar26 = uVar38 - uVar42;
        if (uVar34 < uVar26) break;
        if (uVar52 + uVar45 <= ringbuffer_mask) {
          uVar36 = (ulong)(uVar42 & (uint)ringbuffer_mask);
          if ((uVar36 + uVar52 <= ringbuffer_mask) &&
             (ringbuffer[uVar52 + uVar45] == ringbuffer[uVar36 + uVar52])) {
            if (7 < uVar23) {
              lVar48 = 0;
              uVar53 = 0;
LAB_00114d03:
              if (*(ulong *)(piVar2 + uVar53 * 2) == *(ulong *)(ringbuffer + uVar53 * 8 + uVar36))
              goto code_r0x00114d15;
              uVar53 = *(ulong *)(ringbuffer + uVar53 * 8 + uVar36) ^
                       *(ulong *)(piVar2 + uVar53 * 2);
              uVar36 = 0;
              if (uVar53 != 0) {
                for (; (uVar53 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              uVar53 = (uVar36 >> 3 & 0x1fffffff) - lVar48;
              goto LAB_00114d4d;
            }
            uVar56 = 0;
            piVar57 = piVar2;
LAB_00114dc3:
            uVar53 = uVar56;
            if (uVar47 != 0) {
              uVar28 = uVar47 | uVar56;
              uVar35 = uVar47;
              do {
                uVar53 = uVar56;
                if (ringbuffer[uVar56 + uVar36] != (uint8_t)*piVar57) break;
                piVar57 = (int *)((long)piVar57 + 1);
                uVar56 = uVar56 + 1;
                uVar35 = uVar35 - 1;
                uVar53 = uVar28;
              } while (uVar35 != 0);
            }
LAB_00114d4d:
            if ((bVar58) && ((ulong)(long)(int)num_literals[(long)psVar49 * 2] < uVar53 + uVar38)) {
              uVar53 = (long)(int)num_literals[(long)psVar49 * 2] - uVar38;
            }
            if (3 < uVar53) {
              iVar22 = 0x1f;
              if ((uint)uVar26 != 0) {
                for (; (uint)uVar26 >> iVar22 == 0; iVar22 = iVar22 + -1) {
                }
              }
              uVar36 = (ulong)(iVar22 * -0x1e + 0x780) + uVar53 * 0x87;
              if (local_150 < uVar36) {
                uVar52 = uVar53;
                local_150 = uVar36;
                local_f0 = uVar26;
                local_e8 = uVar53;
              }
            }
          }
        }
      } while (uVar41 < uVar51);
    }
    *(int *)(puVar13 + (ulong)uVar21 * 2 + (ulong)(uVar40 & uVar6) * 2) = (int)uVar38;
    *(ushort *)(uVar12 + uVar54 * 2) = uVar6 + 1;
    if (local_150 != 0x7e4) {
      iVar22 = 0;
      bVar58 = true;
      goto LAB_001150b1;
    }
    if (!bVar18) {
      if (bVar58) {
        uVar41 = (ulong)(int)num_literals[(long)psVar49 * 2];
        goto LAB_00115b36;
      }
      goto LAB_00115c39;
    }
    lVar48 = *(long *)&(params->dictionary).num_transforms;
    uVar34 = *(ulong *)(lVar48 + 8);
    local_120 = *(ulong *)(lVar48 + 0x10);
    bVar18 = true;
    if (uVar34 >> 7 <= local_120) {
      uVar45 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      lVar14 = *(long *)(literal_context_lut + 0x78);
      iVar22 = 0;
      local_150 = 0x7e4;
      bVar58 = true;
LAB_00114ed9:
      uVar34 = uVar34 + 1;
      *(ulong *)(lVar48 + 8) = uVar34;
      bVar30 = *(byte *)(lVar14 + uVar45);
      uVar41 = (ulong)bVar30;
      if ((uVar41 != 0) && (uVar41 <= uVar23)) {
        uVar52 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar45 * 2);
        lVar15 = *(long *)(literal_context_lut + 0x58);
        pcVar37 = (char *)(uVar52 * uVar41 + *(long *)(lVar15 + 0xa8) +
                          (ulong)*(uint *)(lVar15 + 0x20 + uVar41 * 4));
        if (7 < bVar30) {
          uVar54 = (ulong)(bVar30 & 0xfffffff8);
          lVar50 = 0;
          uVar51 = 0;
LAB_00114f3e:
          if (*(ulong *)(pcVar37 + uVar51 * 8) == *(ulong *)(piVar2 + uVar51 * 2))
          goto code_r0x00114f50;
          uVar54 = *(ulong *)(piVar2 + uVar51 * 2) ^ *(ulong *)(pcVar37 + uVar51 * 8);
          uVar51 = 0;
          if (uVar54 != 0) {
            for (; (uVar54 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
            }
          }
          uVar51 = (uVar51 >> 3 & 0x1fffffff) - lVar50;
          goto LAB_00114f78;
        }
        uVar54 = 0;
        goto LAB_0011504b;
      }
      goto LAB_00114fd2;
    }
    goto LAB_00115a58;
  }
  uVar41 = (ulong)(int)num_literals[(long)psVar49 * 2];
  if (uVar41 < uVar38) {
    psVar24 = num_literals + (long)psVar49 * 2;
    do {
      psVar49 = (size_t *)((long)psVar49 + 1);
      if (back_refs_position == psVar49) {
        *(size_t **)backward_references = psVar49;
        bVar58 = false;
        psVar49 = back_refs_position;
        goto LAB_001149af;
      }
      uVar41 = (ulong)(int)psVar24[2];
      psVar24 = psVar24 + 2;
    } while (uVar41 < uVar38);
    *(size_t **)backward_references = psVar49;
    bVar58 = psVar49 < back_refs_position;
  }
  else {
    psVar24 = num_literals + (long)psVar49 * 2;
    bVar58 = true;
  }
  if (uVar38 != uVar41) {
LAB_001149af:
    bVar18 = false;
    goto LAB_001149b1;
  }
  uVar21 = (uint)psVar24[1];
  local_f0 = (ulong)(int)uVar21;
  if ((uVar38 - local_f0 < uVar38) && (uVar21 <= *(uint *)((long)psVar24 + 0xc))) {
    uVar34 = uVar38 - local_f0 & ringbuffer_mask;
    if (7 < uVar23) {
      uVar25 = uVar23 & 0xfffffffffffffff8;
      puVar46 = ringbuffer + uVar25 + uVar45;
      lVar48 = 0;
      uVar41 = 0;
LAB_00114953:
      uVar52 = *(ulong *)(ringbuffer + uVar45 + uVar41 * 8);
      if (uVar52 == *(ulong *)(ringbuffer + uVar41 * 8 + uVar34)) goto code_r0x00114964;
      uVar52 = *(ulong *)(ringbuffer + uVar41 * 8 + uVar34) ^ uVar52;
      uVar34 = 0;
      if (uVar52 != 0) {
        for (; (uVar52 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
        }
      }
      uVar45 = (uVar34 >> 3 & 0x1fffffff) - lVar48;
      goto LAB_00115d6e;
    }
    uVar25 = 0;
    puVar46 = ringbuffer + uVar45;
LAB_00116406:
    uVar41 = uVar23 & 7;
    uVar45 = uVar25;
    if (uVar41 != 0) {
      uVar52 = uVar25 | uVar41;
      do {
        uVar45 = uVar25;
        if (ringbuffer[uVar25 + uVar34] != *puVar46) break;
        puVar46 = puVar46 + 1;
        uVar25 = uVar25 + 1;
        uVar41 = uVar41 - 1;
        uVar45 = uVar52;
      } while (uVar41 != 0);
    }
LAB_00115d6e:
    local_e8 = (ulong)*(int *)((long)num_literals + (long)psVar49 * 0x10 + 4);
    if (uVar45 < local_e8) {
      local_e8 = uVar45;
    }
    iVar22 = 0x1f;
    if (uVar21 != 0) {
      for (; uVar21 >> iVar22 == 0; iVar22 = iVar22 + -1) {
      }
    }
    local_150 = (ulong)(iVar22 * -0x1e + 0x780) + local_e8 * 0x87;
    bVar18 = false;
    bVar58 = false;
    iVar22 = 0;
    goto LAB_001150b1;
  }
LAB_00115b36:
  if (uVar38 == uVar41) {
    uVar21 = (uint)num_literals[(long)psVar49 * 2 + 1];
    local_f0 = (ulong)(int)uVar21;
    if (*(int *)((long)num_literals + (long)psVar49 * 0x10 + 0xc) < (int)uVar21) {
      uVar40 = *(uint *)((long)num_literals + (long)psVar49 * 0x10 + 4);
      uVar25 = (ulong)uVar40;
      if (uVar40 - 4 < 0x15 && (int)uVar21 < 0x7ffffffd) {
        uVar42 = ~(uint)uVar34 + uVar21;
        lVar48 = *(long *)(literal_context_lut + 0x58);
        iVar22 = (int)uVar42 >> (*(byte *)(lVar48 + uVar25) & 0x1f);
        if (iVar22 < *(int *)(literal_context_lut + 0x60)) {
          uVar10 = *(uint *)(lVar48 + 0x20 + uVar25 * 4);
          uVar7 = kBitMask[*(byte *)(lVar48 + uVar25)];
          lVar48 = *(long *)(lVar48 + 0xa8);
          pBVar29 = BrotliGetTransforms();
          puVar46 = (uint8_t *)malloc(uVar25 * 10);
          iVar22 = BrotliTransformDictionaryWord
                             (puVar46,(uint8_t *)
                                      ((ulong)uVar10 + lVar48 +
                                      (long)(int)((uVar42 & uVar7) * uVar40)),uVar40,pBVar29,iVar22)
          ;
          local_e8 = (ulong)iVar22;
          iVar43 = bcmp(ringbuffer + uVar45,puVar46,local_e8);
          if (iVar43 == 0) {
            iVar43 = 0x1f;
            if (uVar21 != 0) {
              for (; uVar21 >> iVar43 == 0; iVar43 = iVar43 + -1) {
              }
            }
            local_150 = (ulong)(iVar43 * -0x1e + 0x780) + local_e8 * 0x87;
            iVar22 = uVar40 - iVar22;
            bVar18 = false;
            bVar58 = false;
            goto LAB_001150b1;
          }
        }
      }
    }
  }
LAB_00115c39:
  local_f8 = local_f8 + 1;
  position = uVar38 + 1;
  goto LAB_0011619f;
code_r0x00114aa0:
  uVar36 = uVar36 + 1;
  lVar48 = lVar48 + -8;
  uVar53 = uVar23 & 0xfffffffffffffff8;
  puVar55 = puVar46 + (uVar23 & 0xfffffffffffffff8);
  if (uVar23 >> 3 == uVar36) goto LAB_00114b93;
  goto LAB_00114a8e;
code_r0x00114d15:
  uVar53 = uVar53 + 1;
  lVar48 = lVar48 + -8;
  uVar56 = uVar23 & 0xfffffffffffffff8;
  piVar57 = (int *)(ringbuffer + (uVar23 & 0xfffffffffffffff8) + uVar45);
  if (uVar23 >> 3 == uVar53) goto LAB_00114dc3;
  goto LAB_00114d03;
code_r0x00114f50:
  uVar51 = uVar51 + 1;
  lVar50 = lVar50 + -8;
  if (bVar30 >> 3 == uVar51) goto code_r0x00114f5c;
  goto LAB_00114f3e;
code_r0x00114f5c:
  pcVar37 = pcVar37 + -lVar50;
LAB_0011504b:
  uVar47 = uVar41 & 7;
  uVar51 = uVar54;
  if ((bVar30 & 7) != 0) {
    uVar26 = uVar54 | uVar47;
    do {
      uVar51 = uVar54;
      if (*(char *)((long)piVar2 + uVar54) != *pcVar37) break;
      pcVar37 = pcVar37 + 1;
      uVar54 = uVar54 + 1;
      uVar47 = uVar47 - 1;
      uVar51 = uVar26;
    } while (uVar47 != 0);
  }
LAB_00114f78:
  if (((uVar51 != 0) && (uVar41 < *(uint *)(literal_context_lut + 100) + uVar51)) &&
     (uVar41 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar41 - uVar51) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar41 - uVar51) * 4 << (*(byte *)(lVar15 + uVar41) & 0x3f)) +
               uVar52 + local_d0 + 1, uVar41 <= uVar25)) {
    iVar43 = 0x1f;
    if ((uint)uVar41 != 0) {
      for (; (uint)uVar41 >> iVar43 == 0; iVar43 = iVar43 + -1) {
      }
    }
    uVar52 = (uVar51 * 0x87 - (ulong)(uint)(iVar43 * 0x1e)) + 0x780;
    if (local_150 <= uVar52) {
      iVar22 = (uint)bVar30 - (int)uVar51;
      local_120 = local_120 + 1;
      *(ulong *)(lVar48 + 0x10) = local_120;
      local_150 = uVar52;
      local_f0 = uVar41;
      local_e8 = uVar51;
    }
  }
LAB_00114fd2:
  uVar45 = uVar45 + 1;
  bVar18 = !bVar58;
  bVar58 = false;
  if (bVar18) goto LAB_00115c74;
  goto LAB_00114ed9;
LAB_00115c74:
  bVar18 = true;
  bVar58 = true;
LAB_001150b1:
  if (local_150 < 0x7e5) {
LAB_00115a58:
    local_f8 = local_f8 + 1;
    position = uVar38 + 1;
    if (bVar18 && local_a8 < position) {
      if ((uint)((int)lVar33 * 4) + local_a8 < position) {
        uVar23 = uVar38 + 0x11;
        if (uVar4 <= uVar38 + 0x11) {
          uVar23 = uVar4;
        }
        if (position < uVar23) {
          uVar12 = (params->dictionary).cutoffTransforms;
          puVar13 = (params->dictionary).hash_table_words;
          uVar34._0_4_ = (params->dist).alphabet_size_max;
          uVar34._4_4_ = (params->dist).alphabet_size_limit;
          uVar8 = (params->dist).distance_postfix_bits;
          sVar20 = (params->dist).max_distance;
          uVar9 = *(undefined4 *)((long)&(params->dist).max_distance + 4);
          do {
            uVar25 = (*(ulong *)(ringbuffer + (position & ringbuffer_mask)) & uVar34) *
                     0x1fe35a7bd3579bd3 >> ((byte)uVar8 & 0x3f);
            uVar38 = uVar25 & 0xffffffff;
            uVar6 = *(ushort *)(uVar12 + uVar38 * 2);
            *(ushort *)(uVar12 + uVar38 * 2) = uVar6 + 1;
            *(int *)(puVar13 +
                    (ulong)((uint)sVar20 & (uint)uVar6) * 2 +
                    (ulong)(uint)((int)uVar25 << ((byte)uVar9 & 0x1f)) * 2) = (int)position;
            local_f8 = local_f8 + 4;
            position = position + 4;
          } while (position < uVar23);
        }
      }
      else {
        uVar23 = uVar38 + 9;
        if (uVar4 <= uVar38 + 9) {
          uVar23 = uVar4;
        }
        if (position < uVar23) {
          uVar12 = (params->dictionary).cutoffTransforms;
          puVar13 = (params->dictionary).hash_table_words;
          uVar38._0_4_ = (params->dist).alphabet_size_max;
          uVar38._4_4_ = (params->dist).alphabet_size_limit;
          uVar8 = (params->dist).distance_postfix_bits;
          sVar20 = (params->dist).max_distance;
          uVar9 = *(undefined4 *)((long)&(params->dist).max_distance + 4);
          do {
            uVar25 = (*(ulong *)(ringbuffer + (position & ringbuffer_mask)) & uVar38) *
                     0x1fe35a7bd3579bd3 >> ((byte)uVar8 & 0x3f);
            uVar34 = uVar25 & 0xffffffff;
            uVar6 = *(ushort *)(uVar12 + uVar34 * 2);
            *(ushort *)(uVar12 + uVar34 * 2) = uVar6 + 1;
            *(int *)(puVar13 +
                    (ulong)((uint)sVar20 & (uint)uVar6) * 2 +
                    (ulong)(uint)((int)uVar25 << ((byte)uVar9 & 0x1f)) * 2) = (int)position;
            local_f8 = local_f8 + 2;
            position = position + 2;
          } while (position < uVar23);
        }
      }
    }
    goto LAB_0011619f;
  }
  local_118 = local_f0;
  local_168 = local_e8;
  uVar34 = local_f8;
  if (bVar58) {
    uVar12 = (params->dictionary).cutoffTransforms;
    puVar13 = (params->dictionary).hash_table_words;
    uVar45 = local_f8 + 4;
    uVar41 = (lVar3 + num_bytes) - uVar38;
    iVar31 = 0;
    uVar25 = uVar38;
    iVar43 = iVar22;
    do {
      uVar52 = uVar41 >> 3;
      uVar23 = uVar23 - 1;
      uVar34 = local_e8 - 1;
      if (uVar23 <= local_e8 - 1) {
        uVar34 = uVar23;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        uVar34 = 0;
      }
      uVar38 = uVar25 + 1;
      uVar51 = uVar5;
      if (uVar38 < uVar5) {
        uVar51 = uVar38;
      }
      local_d0 = lVar11 + uVar25 + 1;
      if (uVar5 <= local_d0) {
        local_d0 = uVar5;
      }
      uVar54 = *(ulong *)(literal_context_lut + 0x50);
      uVar47 = uVar38 & ringbuffer_mask;
      psVar49 = *(size_t **)backward_references;
      bVar58 = true;
      if (psVar49 < back_refs_position) {
        uVar26 = (ulong)(int)num_literals[(long)psVar49 * 2];
        if (uVar26 < uVar38) {
          psVar24 = num_literals + (long)psVar49 * 2;
          do {
            psVar49 = (size_t *)((long)psVar49 + 1);
            if (back_refs_position == psVar49) {
              *(size_t **)backward_references = psVar49;
              psVar49 = back_refs_position;
              goto LAB_0011524c;
            }
            uVar26 = (ulong)(int)psVar24[2];
            psVar24 = psVar24 + 2;
          } while (uVar26 < uVar38);
          *(size_t **)backward_references = psVar49;
          bVar58 = back_refs_position <= psVar49;
        }
        else {
          psVar24 = num_literals + (long)psVar49 * 2;
          bVar58 = false;
        }
        if (uVar38 != uVar26 || bVar18) goto LAB_0011524c;
        local_118 = (ulong)(int)(uint)psVar24[1];
        if ((uVar38 - local_118 < uVar38) && ((uint)psVar24[1] <= *(uint *)((long)psVar24 + 0xc))) {
          uVar34 = uVar38 - local_118 & ringbuffer_mask;
          puVar46 = ringbuffer + uVar47;
          if (uVar23 < 8) {
            uVar25 = 0;
            goto LAB_0011643b;
          }
          lVar48 = 0;
          uVar25 = 0;
          goto LAB_00116382;
        }
        local_118 = 0;
        local_168 = 0;
LAB_001156f1:
        iVar22 = 0;
        if ((!bVar58) && (uVar38 == (long)(int)num_literals[(long)psVar49 * 2])) {
          iVar17 = (int)num_literals[(long)psVar49 * 2 + 1];
          if (*(int *)((long)num_literals + (long)psVar49 * 0x10 + 0xc) < iVar17) {
            uVar21 = *(uint *)((long)num_literals + (long)psVar49 * 0x10 + 4);
            uVar23 = (ulong)uVar21;
            iVar22 = 0;
            if (uVar21 - 4 < 0x15 && iVar17 < 0x7ffffffd) {
              uVar40 = ~(uint)uVar51 + iVar17;
              lVar48 = *(long *)(literal_context_lut + 0x58);
              iVar43 = (int)uVar40 >> (*(byte *)(lVar48 + uVar23) & 0x1f);
              if (iVar43 < *(int *)(literal_context_lut + 0x60)) {
                uVar42 = *(uint *)(lVar48 + 0x20 + uVar23 * 4);
                uVar10 = kBitMask[*(byte *)(lVar48 + uVar23)];
                lVar48 = *(long *)(lVar48 + 0xa8);
                pBVar29 = BrotliGetTransforms();
                puVar46 = (uint8_t *)malloc(uVar23 * 10);
                iVar43 = BrotliTransformDictionaryWord
                                   (puVar46,(uint8_t *)
                                            ((ulong)uVar42 + lVar48 +
                                            (long)(int)((uVar40 & uVar10) * uVar21)),uVar21,pBVar29,
                                    iVar43);
                iVar31 = bcmp(ringbuffer + uVar47,puVar46,(long)iVar43);
                if (iVar31 == 0) {
                  iVar22 = uVar21 - iVar43;
                  local_168 = (long)iVar43;
                  local_118 = (long)iVar17;
                }
              }
            }
            goto LAB_001163d5;
          }
        }
        local_160 = 0x7e4;
      }
      else {
LAB_0011524c:
        uVar26 = (ulong)*(int *)&(params->dictionary).words;
        if (uVar26 != 0) {
          puVar46 = ringbuffer + uVar47;
          uVar36 = (ulong)((uint)uVar23 & 7);
          local_160 = 0x7e4;
          uVar53 = 0;
          local_168 = 0;
          local_118 = 0;
LAB_001152c8:
          uVar56 = (ulong)*(int *)((long)&(hasher->common).extra + uVar53 * 4);
          if (((uVar56 <= uVar51) && (uVar38 - uVar56 < uVar38)) &&
             (uVar34 + uVar47 <= ringbuffer_mask)) {
            uVar35 = uVar38 - uVar56 & ringbuffer_mask;
            if ((ringbuffer_mask < uVar35 + uVar34) ||
               (ringbuffer[uVar34 + uVar47] != ringbuffer[uVar35 + uVar34])) goto LAB_0011534f;
            uVar28 = uVar36;
            if (7 < uVar23) {
              lVar48 = 0;
              uVar44 = 0;
LAB_00115311:
              if (*(ulong *)(puVar46 + uVar44 * 8) == *(ulong *)(ringbuffer + uVar44 * 8 + uVar35))
              goto code_r0x00115323;
              uVar28 = *(ulong *)(ringbuffer + uVar44 * 8 + uVar35) ^
                       *(ulong *)(puVar46 + uVar44 * 8);
              uVar35 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                }
              }
              uVar44 = (uVar35 >> 3 & 0x1fffffff) - lVar48;
              goto LAB_00115372;
            }
            uVar44 = 0;
            puVar55 = puVar46;
            goto joined_r0x00115410;
          }
          goto LAB_0011534f;
        }
        local_160 = 0x7e4;
        local_118 = 0;
        local_168 = 0;
LAB_0011544f:
        uVar26._0_4_ = (params->dist).alphabet_size_max;
        uVar26._4_4_ = (params->dist).alphabet_size_limit;
        uVar26 = (*(ulong *)(ringbuffer + uVar47) & uVar26) * 0x1fe35a7bd3579bd3 >>
                 ((byte)(params->dist).distance_postfix_bits & 0x3f);
        uVar53 = uVar26 & 0xffffffff;
        uVar21 = (int)uVar26 << (*(byte *)((long)&(params->dist).max_distance + 4) & 0x1f);
        piVar2 = (int *)(ringbuffer + uVar47);
        uVar6 = *(ushort *)(uVar12 + uVar53 * 2);
        uVar36 = (ulong)uVar6;
        piVar57 = &(params->hasher).num_last_distances_to_check;
        uVar26 = 0;
        if (*(ulong *)piVar57 <= uVar36) {
          uVar26 = uVar36 - *(long *)piVar57;
        }
        uVar40 = (uint)(params->dist).max_distance;
        if (uVar26 < uVar36) {
          uVar56 = (ulong)((uint)uVar23 & 7);
LAB_00115500:
          uVar36 = uVar36 - 1;
          uVar42 = *(uint *)(puVar13 + (ulong)uVar21 * 2 + (ulong)((uint)uVar36 & uVar40) * 2);
          uVar35 = uVar38 - uVar42;
          if (uVar35 <= uVar51) {
            if (uVar34 + uVar47 <= ringbuffer_mask) {
              uVar28 = (ulong)(uVar42 & (uint)ringbuffer_mask);
              if ((ringbuffer_mask < uVar28 + uVar34) ||
                 (ringbuffer[uVar34 + uVar47] != ringbuffer[uVar28 + uVar34])) goto LAB_001155ff;
              uVar44 = uVar56;
              if (7 < uVar23) {
                lVar48 = 0;
                uVar27 = 0;
LAB_0011555e:
                if (*(ulong *)(piVar2 + uVar27 * 2) == *(ulong *)(ringbuffer + uVar27 * 8 + uVar28))
                goto code_r0x00115570;
                uVar44 = *(ulong *)(ringbuffer + uVar27 * 8 + uVar28) ^
                         *(ulong *)(piVar2 + uVar27 * 2);
                uVar28 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar27 = (uVar28 >> 3 & 0x1fffffff) - lVar48;
                goto LAB_001155a2;
              }
              uVar27 = 0;
              piVar57 = piVar2;
              goto joined_r0x00115622;
            }
            goto LAB_001155ff;
          }
        }
LAB_00115645:
        *(int *)(puVar13 + (ulong)uVar21 * 2 + (ulong)(uVar40 & uVar6) * 2) = (int)uVar38;
        *(ushort *)(uVar12 + uVar53 * 2) = uVar6 + 1;
        iVar22 = 0;
        if (local_160 == 0x7e4) {
          if (!bVar18) goto LAB_001156f1;
          lVar48 = *(long *)&(params->dictionary).num_transforms;
          uVar34 = *(ulong *)(lVar48 + 8);
          local_e0 = *(ulong *)(lVar48 + 0x10);
          local_160 = 0x7e4;
          if (uVar34 >> 7 <= local_e0) {
            uVar52 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
            lVar14 = *(long *)(literal_context_lut + 0x78);
            iVar22 = 0;
            local_160 = 0x7e4;
            bVar58 = true;
LAB_0011578a:
            uVar34 = uVar34 + 1;
            *(ulong *)(lVar48 + 8) = uVar34;
            bVar30 = *(byte *)(lVar14 + uVar52);
            uVar51 = (ulong)bVar30;
            if ((uVar51 != 0) && (uVar51 <= uVar23)) {
              uVar47 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar52 * 2);
              lVar15 = *(long *)(literal_context_lut + 0x58);
              pcVar37 = (char *)(uVar47 * uVar51 + *(long *)(lVar15 + 0xa8) +
                                (ulong)*(uint *)(lVar15 + 0x20 + uVar51 * 4));
              if (7 < bVar30) {
                uVar36 = (ulong)(bVar30 & 0xfffffff8);
                lVar50 = 0;
                uVar26 = 0;
LAB_00115801:
                if (*(ulong *)(pcVar37 + uVar26 * 8) == *(ulong *)(piVar2 + uVar26 * 2))
                goto code_r0x00115813;
                uVar36 = *(ulong *)(piVar2 + uVar26 * 2) ^ *(ulong *)(pcVar37 + uVar26 * 8);
                uVar26 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar26 = (uVar26 >> 3 & 0x1fffffff) - lVar50;
                goto LAB_0011584f;
              }
              uVar36 = 0;
              goto LAB_00115960;
            }
            goto LAB_001158c7;
          }
        }
      }
LAB_001159ab:
      if (local_160 < local_150 + 0xaf) {
        local_118 = local_f0;
        local_168 = local_e8;
        uVar38 = uVar25;
        uVar34 = local_f8;
        local_d0 = lVar11 + uVar25;
        iVar22 = iVar43;
        if (uVar5 <= lVar11 + uVar25) {
          local_d0 = uVar5;
        }
        break;
      }
      uVar34 = uVar45;
      if (iVar31 == 3) break;
      local_f8 = local_f8 + 1;
      iVar31 = iVar31 + 1;
      uVar52 = uVar25 + 9;
      uVar41 = uVar41 - 1;
      local_f0 = local_118;
      local_e8 = local_168;
      uVar25 = uVar38;
      local_150 = local_160;
      uVar34 = local_f8;
      iVar43 = iVar22;
    } while (uVar52 < uVar1);
  }
LAB_00115e0b:
  local_f8 = uVar34;
  if (local_d0 < local_118) {
LAB_00115e1d:
    uVar34 = local_118 + 0xf;
LAB_00115e21:
    if ((local_118 <= local_d0) && (uVar34 != 0)) {
      *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
           (int)(hasher->common).dict_num_lookups;
      pvVar16 = (hasher->common).extra;
      *(void **)((long)&(hasher->common).extra + 4) = pvVar16;
      iVar43 = (int)local_118;
      *(int *)&(hasher->common).extra = iVar43;
      uVar21 = *(uint *)&(params->dictionary).words;
      if (4 < (int)uVar21) {
        *(int *)&(hasher->common).dict_num_matches = iVar43 + -1;
        *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar43 + 1;
        (hasher->common).params.type = iVar43 + -2;
        (hasher->common).params.bucket_bits = iVar43 + 2;
        (hasher->common).params.block_bits = iVar43 + -3;
        (hasher->common).params.hash_len = iVar43 + 3;
        if (10 < uVar21) {
          iVar43 = (int)pvVar16;
          (hasher->common).params.num_last_distances_to_check = iVar43 + -1;
          (hasher->common).is_prepared_ = iVar43 + 1;
          *(int *)&hasher->privat = iVar43 + -2;
          *(int *)((long)&hasher->privat + 4) = iVar43 + 2;
          (hasher->privat)._H5.block_size_ = CONCAT44(iVar43 + 3,iVar43 + -3);
        }
      }
    }
  }
  else {
    uVar23 = (ulong)*(int *)&(hasher->common).extra;
    if (local_118 != uVar23) {
      uVar25 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
      uVar34 = 1;
      if (local_118 != uVar25) {
        uVar23 = (local_118 + 3) - uVar23;
        if (uVar23 < 7) {
          bVar30 = (byte)((int)uVar23 << 2);
          uVar21 = 0x9750468;
        }
        else {
          uVar25 = (local_118 + 3) - uVar25;
          if (6 < uVar25) {
            uVar34 = 2;
            if ((local_118 != (long)(int)(hasher->common).dict_num_lookups) &&
               (uVar34 = 3,
               local_118 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)))
            goto LAB_00115e1d;
            goto LAB_00115e21;
          }
          bVar30 = (byte)((int)uVar25 << 2);
          uVar21 = 0xfdb1ace;
        }
        uVar34 = (ulong)(uVar21 >> (bVar30 & 0x1f) & 0xf);
      }
      goto LAB_00115e21;
    }
    uVar34 = 0;
  }
  uVar21 = (uint)local_f8;
  *(uint *)local_c8 = uVar21;
  *(uint *)((long)local_c8 + 4) = iVar22 << 0x19 | (uint)local_168;
  uVar23 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  uVar40 = 0;
  if (uVar23 <= uVar34) {
    bVar30 = (byte)*(uint *)(literal_context_lut + 0x40);
    uVar25 = ((4L << (bVar30 & 0x3f)) + (uVar34 - *(uint *)(literal_context_lut + 0x44))) - 0x10;
    uVar40 = 0x1f;
    uVar42 = (uint)uVar25;
    if (uVar42 != 0) {
      for (; uVar42 >> uVar40 == 0; uVar40 = uVar40 - 1) {
      }
    }
    uVar40 = (uVar40 ^ 0xffffffe0) + 0x1f;
    uVar45 = (ulong)((uVar25 >> ((ulong)uVar40 & 0x3f) & 1) != 0);
    lVar48 = (ulong)uVar40 - (ulong)*(uint *)(literal_context_lut + 0x40);
    uVar34 = (~(-1 << (bVar30 & 0x1f)) & uVar42) + uVar23 +
             (uVar45 + lVar48 * 2 + 0xfffe << (bVar30 & 0x3f)) | lVar48 * 0x400;
    uVar40 = (uint)(uVar25 - (uVar45 + 2 << ((byte)uVar40 & 0x3f)) >> (bVar30 & 0x3f));
  }
  *(short *)((long)local_c8 + 0xe) = (short)uVar34;
  *(uint *)(local_c8 + 1) = uVar40;
  if (5 < local_f8) {
    if (local_f8 < 0x82) {
      uVar21 = 0x1f;
      uVar40 = (uint)(local_f8 - 2);
      if (uVar40 != 0) {
        for (; uVar40 >> uVar21 == 0; uVar21 = uVar21 - 1) {
        }
      }
      uVar21 = (int)(local_f8 - 2 >> ((char)(uVar21 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar21 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_f8 < 0x842) {
      uVar40 = 0x1f;
      if (uVar21 - 0x42 != 0) {
        for (; uVar21 - 0x42 >> uVar40 == 0; uVar40 = uVar40 - 1) {
        }
      }
      uVar21 = (uVar40 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar21 = 0x15;
      if (0x1841 < local_f8) {
        uVar21 = (uint)(ushort)(0x17 - (local_f8 < 0x5842));
      }
    }
  }
  uVar40 = iVar22 + (uint)local_168;
  if (uVar40 < 10) {
    uVar42 = uVar40 - 2;
  }
  else if (uVar40 < 0x86) {
    uVar40 = uVar40 - 6;
    uVar42 = 0x1f;
    if (uVar40 != 0) {
      for (; uVar40 >> uVar42 == 0; uVar42 = uVar42 - 1) {
      }
    }
    uVar42 = (uVar40 >> ((char)(uVar42 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar42 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar42 = 0x17;
    if (uVar40 < 0x846) {
      uVar42 = 0x1f;
      if (uVar40 - 0x46 != 0) {
        for (; uVar40 - 0x46 >> uVar42 == 0; uVar42 = uVar42 - 1) {
        }
      }
      uVar42 = (uVar42 ^ 0xffe0) + 0x2c;
    }
  }
  uVar6 = (ushort)uVar42;
  uVar39 = (uVar6 & 7) + ((ushort)uVar21 & 7) * 8;
  if ((((uVar34 & 0x3ff) == 0) && ((ushort)uVar21 < 8)) && (uVar6 < 0x10)) {
    if (7 < uVar6) {
      uVar39 = uVar39 | 0x40;
    }
  }
  else {
    iVar22 = ((uVar21 & 0xffff) >> 3) * 3 + ((uVar42 & 0xffff) >> 3);
    uVar39 = uVar39 + ((ushort)(0x520d40 >> ((char)iVar22 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar22 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_c8 + 0xc) = uVar39;
  *num_commands = *num_commands + local_f8;
  position = local_168 + uVar38;
  uVar23 = sVar32;
  if (position < sVar32) {
    uVar23 = position;
  }
  uVar34 = uVar38 + 2;
  if (local_118 < local_168 >> 2) {
    uVar25 = position + local_118 * -4;
    if (uVar25 < uVar34) {
      uVar25 = uVar34;
    }
    uVar34 = uVar25;
    if (uVar23 < uVar25) {
      uVar34 = uVar23;
    }
  }
  local_a8 = lVar33 + local_168 * 2 + uVar38;
  local_c8 = local_c8 + 2;
  if (uVar34 < uVar23) {
    uVar12 = (params->dictionary).cutoffTransforms;
    puVar13 = (params->dictionary).hash_table_words;
    uVar25._0_4_ = (params->dist).alphabet_size_max;
    uVar25._4_4_ = (params->dist).alphabet_size_limit;
    uVar8 = (params->dist).distance_postfix_bits;
    sVar20 = (params->dist).max_distance;
    uVar9 = *(undefined4 *)((long)&(params->dist).max_distance + 4);
    do {
      uVar45 = (*(ulong *)(ringbuffer + (uVar34 & ringbuffer_mask)) & uVar25) * 0x1fe35a7bd3579bd3
               >> ((byte)uVar8 & 0x3f);
      uVar38 = uVar45 & 0xffffffff;
      uVar6 = *(ushort *)(uVar12 + uVar38 * 2);
      *(ushort *)(uVar12 + uVar38 * 2) = uVar6 + 1;
      *(int *)(puVar13 +
              (ulong)((uint)sVar20 & (uint)uVar6) * 2 +
              (ulong)(uint)((int)uVar45 << ((byte)uVar9 & 0x1f)) * 2) = (int)uVar34;
      uVar34 = uVar34 + 1;
    } while (uVar23 != uVar34);
  }
  local_f8 = 0;
LAB_0011619f:
  uVar38 = position;
  if (uVar1 <= position + 8) goto LAB_0011646c;
  goto LAB_00114824;
code_r0x00114964:
  uVar41 = uVar41 + 1;
  lVar48 = lVar48 + -8;
  if (uVar23 >> 3 == uVar41) goto LAB_00116406;
  goto LAB_00114953;
code_r0x00115323:
  uVar44 = uVar44 + 1;
  lVar48 = lVar48 + -8;
  if (uVar52 == uVar44) goto code_r0x00115334;
  goto LAB_00115311;
code_r0x00115334:
  uVar44 = -lVar48;
  puVar55 = puVar46 + -lVar48;
joined_r0x00115410:
  for (; (uVar28 != 0 && (ringbuffer[uVar44 + uVar35] == *puVar55)); uVar44 = uVar44 + 1) {
    uVar28 = uVar28 - 1;
    puVar55 = puVar55 + 1;
  }
LAB_00115372:
  if ((!bVar18 && !bVar58) && ((ulong)(long)(int)num_literals[(long)psVar49 * 2] < uVar44 + uVar38))
  {
    uVar44 = (long)(int)num_literals[(long)psVar49 * 2] - uVar38;
  }
  if (((2 < uVar44) || ((uVar53 < 2 && (uVar44 == 2)))) &&
     (uVar35 = uVar44 * 0x87 + 0x78f, local_160 < uVar35)) {
    if (uVar53 != 0) {
      uVar35 = uVar35 - ((0x1ca10U >> ((byte)uVar53 & 0xe) & 0xe) + 0x27);
    }
    if (local_160 < uVar35) {
      uVar34 = uVar44;
      local_168 = uVar44;
      local_160 = uVar35;
      local_118 = uVar56;
    }
  }
LAB_0011534f:
  uVar53 = uVar53 + 1;
  if (uVar53 == uVar26) goto LAB_0011544f;
  goto LAB_001152c8;
code_r0x00115570:
  uVar27 = uVar27 + 1;
  lVar48 = lVar48 + -8;
  if (uVar52 == uVar27) goto code_r0x00115581;
  goto LAB_0011555e;
code_r0x00115581:
  uVar27 = -lVar48;
  piVar57 = (int *)((long)piVar2 - lVar48);
joined_r0x00115622:
  for (; (uVar44 != 0 && (ringbuffer[uVar27 + uVar28] == (uint8_t)*piVar57)); uVar27 = uVar27 + 1) {
    uVar44 = uVar44 - 1;
    piVar57 = (int *)((long)piVar57 + 1);
  }
LAB_001155a2:
  if ((!bVar18 && !bVar58) && ((ulong)(long)(int)num_literals[(long)psVar49 * 2] < uVar27 + uVar38))
  {
    uVar27 = (long)(int)num_literals[(long)psVar49 * 2] - uVar38;
  }
  if (3 < uVar27) {
    iVar22 = 0x1f;
    if ((uint)uVar35 != 0) {
      for (; (uint)uVar35 >> iVar22 == 0; iVar22 = iVar22 + -1) {
      }
    }
    uVar28 = (ulong)(iVar22 * -0x1e + 0x780) + uVar27 * 0x87;
    if (local_160 < uVar28) {
      uVar34 = uVar27;
      local_168 = uVar27;
      local_160 = uVar28;
      local_118 = uVar35;
    }
  }
LAB_001155ff:
  if (uVar36 <= uVar26) goto LAB_00115645;
  goto LAB_00115500;
code_r0x00115813:
  uVar26 = uVar26 + 1;
  lVar50 = lVar50 + -8;
  if (bVar30 >> 3 == uVar26) goto code_r0x0011581f;
  goto LAB_00115801;
code_r0x0011581f:
  pcVar37 = pcVar37 + -lVar50;
LAB_00115960:
  uVar53 = uVar51 & 7;
  uVar26 = uVar36;
  if ((bVar30 & 7) != 0) {
    uVar56 = uVar36 | uVar53;
    do {
      uVar26 = uVar36;
      if (*(char *)((long)piVar2 + uVar36) != *pcVar37) break;
      pcVar37 = pcVar37 + 1;
      uVar36 = uVar36 + 1;
      uVar53 = uVar53 - 1;
      uVar26 = uVar56;
    } while (uVar53 != 0);
  }
LAB_0011584f:
  if (((uVar26 != 0) && (uVar51 < *(uint *)(literal_context_lut + 100) + uVar26)) &&
     (uVar51 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar51 - uVar26) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar51 - uVar26) * 4 << (*(byte *)(lVar15 + uVar51) & 0x3f)) +
               uVar47 + local_d0 + 1, uVar51 <= uVar54)) {
    iVar17 = 0x1f;
    if ((uint)uVar51 != 0) {
      for (; (uint)uVar51 >> iVar17 == 0; iVar17 = iVar17 + -1) {
      }
    }
    uVar47 = (uVar26 * 0x87 - (ulong)(uint)(iVar17 * 0x1e)) + 0x780;
    if (local_160 <= uVar47) {
      iVar22 = (uint)bVar30 - (int)uVar26;
      local_e0 = local_e0 + 1;
      *(ulong *)(lVar48 + 0x10) = local_e0;
      local_160 = uVar47;
      local_118 = uVar51;
      local_168 = uVar26;
    }
  }
LAB_001158c7:
  uVar52 = uVar52 + 1;
  bVar19 = !bVar58;
  bVar58 = false;
  if (bVar19) goto LAB_001159ab;
  goto LAB_0011578a;
LAB_00116382:
  if (*(ulong *)(puVar46 + uVar25 * 8) == *(ulong *)(ringbuffer + uVar25 * 8 + uVar34))
  goto code_r0x00116390;
  uVar34 = *(ulong *)(ringbuffer + uVar25 * 8 + uVar34) ^ *(ulong *)(puVar46 + uVar25 * 8);
  uVar23 = 0;
  if (uVar34 != 0) {
    for (; (uVar34 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
    }
  }
  uVar25 = (uVar23 >> 3 & 0x1fffffff) - lVar48;
  goto LAB_001163bc;
code_r0x00116390:
  uVar25 = uVar25 + 1;
  lVar48 = lVar48 + -8;
  if (uVar52 == uVar25) goto code_r0x0011639c;
  goto LAB_00116382;
code_r0x0011639c:
  puVar46 = puVar46 + -lVar48;
  uVar25 = -lVar48;
LAB_0011643b:
  uVar23 = uVar23 & 7;
  for (; (uVar23 != 0 && (ringbuffer[uVar25 + uVar34] == *puVar46)); uVar25 = uVar25 + 1) {
    puVar46 = puVar46 + 1;
    uVar23 = uVar23 - 1;
  }
LAB_001163bc:
  local_168 = (ulong)*(int *)((long)num_literals + (long)psVar49 * 0x10 + 4);
  if (uVar25 < local_168) {
    local_168 = uVar25;
  }
  iVar22 = 0;
LAB_001163d5:
  uVar34 = local_f8 + 1;
  goto LAB_00115e0b;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}